

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::extendBlockwiseSelection
          (QWidgetTextControlPrivate *this,int suggestedNewPosition)

{
  QWidgetTextControl *this_00;
  int iVar1;
  MoveMode MVar2;
  MoveOperation MVar3;
  
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  iVar1 = QTextCursor::selectionStart();
  if (iVar1 <= suggestedNewPosition) {
    iVar1 = QTextCursor::selectionEnd();
    if (suggestedNewPosition <= iVar1) {
      QWidgetTextControl::setTextCursor(this_00,&this->selectedBlockOnTrippleClick,false);
      return;
    }
  }
  iVar1 = QTextCursor::position();
  MVar3 = (int)this + 0x88;
  if (suggestedNewPosition < iVar1) {
    MVar2 = QTextCursor::selectionEnd();
    QTextCursor::setPosition(MVar3,MVar2);
    QTextCursor::setPosition(MVar3,suggestedNewPosition);
    MVar2 = 4;
  }
  else {
    MVar2 = QTextCursor::selectionStart();
    QTextCursor::setPosition(MVar3,MVar2);
    QTextCursor::setPosition(MVar3,suggestedNewPosition);
    QTextCursor::movePosition(MVar3,0xf,1);
    MVar2 = 0x11;
  }
  QTextCursor::movePosition(MVar3,MVar2,1);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 1) == 0) {
    return;
  }
  setClipboardSelection(this);
  selectionChanged(this,true);
  return;
}

Assistant:

void QWidgetTextControlPrivate::extendBlockwiseSelection(int suggestedNewPosition)
{
    Q_Q(QWidgetTextControl);

    // if inside the initial selected line keep that
    if (suggestedNewPosition >= selectedBlockOnTrippleClick.selectionStart()
        && suggestedNewPosition <= selectedBlockOnTrippleClick.selectionEnd()) {
        q->setTextCursor(selectedBlockOnTrippleClick);
        return;
    }

    if (suggestedNewPosition < selectedBlockOnTrippleClick.position()) {
        cursor.setPosition(selectedBlockOnTrippleClick.selectionEnd());
        cursor.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    } else {
        cursor.setPosition(selectedBlockOnTrippleClick.selectionStart());
        cursor.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::EndOfBlock, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
    }

    if (interactionFlags & Qt::TextSelectableByMouse) {
#ifndef QT_NO_CLIPBOARD
        setClipboardSelection();
#endif
        selectionChanged(true);
    }
}